

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application_info_filter_test.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  _func_char_ptr_char_ptr_void_ptr *getenv_wrapper_00;
  ApplicationInfoFilter *__p;
  Hash HVar2;
  Hash HVar3;
  Hash HVar4;
  Hash HVar5;
  Hash HVar6;
  Hash hash4_1;
  Hash hash3_2;
  Hash hash2_2;
  Hash hash1_2;
  Hash hash0_2;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT descriptor_buffer_features_1;
  VkPhysicalDeviceBufferDeviceAddressFeatures bda_features_2;
  VkPhysicalDeviceFeatures2 features2_2;
  VkPhysicalDeviceProperties2 props2_2;
  Hash hash3_1;
  Hash hash2_1;
  Hash hash1_1;
  Hash hash0_1;
  VkPhysicalDeviceDescriptorBufferFeaturesEXT descriptor_buffer_features;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features_1;
  VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features_1;
  VkPhysicalDeviceDescriptorIndexingFeatures indexing_features_1;
  VkPhysicalDeviceVulkan13Features vulkan13_features_1;
  VkPhysicalDeviceVulkan12Features vulkan12_features_1;
  VkPhysicalDeviceBufferDeviceAddressFeatures bda_features_1;
  VkPhysicalDeviceFeatures2 features2_1;
  VkPhysicalDeviceProperties2 props2_1;
  Hash hash18;
  Hash hash17;
  Hash hash16;
  Hash hash15;
  Hash hash14;
  Hash hash13;
  Hash hash12;
  Hash hash11;
  Hash hash10;
  Hash hash9;
  Hash hash8;
  Hash hash7;
  Hash hash6;
  Hash hash5;
  Hash hash4;
  Hash hash3;
  Hash hash2;
  VkPhysicalDeviceFeatures2 features2;
  VkPhysicalDeviceDynamicRenderingFeatures dynamic_rendering_features;
  VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features;
  VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features;
  VkPhysicalDeviceDescriptorIndexingFeatures indexing_features;
  VkPhysicalDeviceVulkan13Features vulkan13_features;
  VkPhysicalDeviceVulkan12Features vulkan12_features;
  VkPhysicalDeviceBufferDeviceAddressFeatures bda_features;
  Hash hash1;
  VkPhysicalDeviceProperties2 props2;
  Hash hash0;
  uint local_84;
  undefined1 local_80 [4];
  uint i;
  VkApplicationInfo appinfo;
  ApplicationInfoFilter *filter;
  unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
  local_40;
  unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
  filter_handle;
  _func_char_ptr_char_ptr_void_ptr *getenv_wrapper;
  UserData data;
  char *test_json;
  
  test_json._4_4_ = 0;
  data.data = 
  "\n{\n\t\"asset\": \"FossilizeApplicationInfoFilter\",\n\t\"version\" : 2,\n\t\"blacklistedApplicationNames\" : [ \"A\",  \"B\", \"C\" ],\n\t\"blacklistedEngineNames\" : [ \"D\", \"E\", \"F\" ],\n\t\"applicationFilters\" : {\n\t\t\"test1\" : { \"minimumApplicationVersion\" : 10 },\n\t\t\"test2\" : { \"minimumApplicationVersion\" : 10, \"minimumEngineVersion\" : 1000 },\n\t\t\"test3\" : { \"minimumApiVersion\" : 50 },\n\t\t\"test4\" : {\n\t\t\t\"blacklistedEnvironments\" : {\n\t\t\t\t\"TEST_ENV\" : { \"contains\" : \"foo\", \"equals\" : \"bar\" },\n\t\t\t\t\"TEST_ENV\" : { \"equals\" : \"bar2\", \"contains\": \"\" },\n\t\t\t\t\"TEST\" : { \"nonnull\" : true }\n\t\t\t}\n\t\t},\n\t\t\"test5\" : { \"recordImmutableSamplers\" : true },\n\t\t\"test6\" : { \"recordImmutableSamplers\" : false }\n\t},\n\t\"engineFilters\" : {\n\t\t\"test1\" : {\n\t\t\t\"minimumEngineVersion\" : 10,\n\t\t\t\"bucketVariantDependencies\" : [\n\t\t\t\t\"BindlessUBO\",\n\t\t\t\t\"VendorID\",\n\t\t\t\t\"MutableDescriptorType\",\n\t\t\t\t\"BufferDeviceAddress\",\n\t\t\t\t\"DummyIgnored\",\n\t\t\t\t\"ApplicationName\",\n\t\t\t\t\"FragmentShadingRate\",\n\t\t\t\t\"DynamicRendering\"\n\t\t\t]\n\t\t},\n\t\t\"variance\" : {\n\t\t\t\"bucketVariantDependencies\" : [ \"VendorID\" ]\n\t\t},\n\t\t\"variance2\" : {\n\t\t\t\"bucketVariantDependencies\" : [ \"VendorID\" ],\n\t\t\t\"bucketVariantFeatureDependencies\" : [\n\t\t\t\t\"BindlessUBO\",\n\t\t\t\t\"MutableDescriptorType\",\n\t\t\t\t\"BufferDeviceAddress\",\n\t\t\t\t\"DummyIgnored\",\n\t\t\t\t\"FragmentShadingRate\",\n\t\t\t\t\"DynamicRendering\",\n\t\t\t\t\"DescriptorBuffer\"\n\t\t\t]\n\t\t},\n\t\t\"test2\" : { \"minimumEngineVersion\" : 10, \"minimumApplicationVersion\" : 1000 },\n\t\t\"test3\" : { \"minimumApiVersion\" : 50 },\n\t\t\"test4\" : {\n\t\t\t\"blacklistedEnvironments\" : {\n\t\t\t\t\"TEST_ENV\" : { \"contains\" : \"foo\", \"equals\" : \"bar\" },\n\t\t\t\t\"TEST_ENV\" : { \"equals\" : \"bar2\", \"contains\": \"\" },\n\t\t\t\t\"TEST\" : { \"nonnull\" : true }\n\t\t\t}\n\t\t},\n\t\t\"test5\" : { \"recordImmutableSamplers\" : false },\n\t\t\"test6\" : { \"recordImmutableSamplers\" : true }\n\t},\n\t\"defaultBucketVariantDependencies\" : [\n\t\t\"ApplicationName\",\n\t\t\"EngineName\"\n\t],\n\t\"defaultBucketVariantFeatureDependencies\" : [\n\t\t\"DescriptorBuffer\"\n\t]\n}\n"
  ;
  bVar1 = write_string_to_file
                    (".__test_appinfo.json",
                     "\n{\n\t\"asset\": \"FossilizeApplicationInfoFilter\",\n\t\"version\" : 2,\n\t\"blacklistedApplicationNames\" : [ \"A\",  \"B\", \"C\" ],\n\t\"blacklistedEngineNames\" : [ \"D\", \"E\", \"F\" ],\n\t\"applicationFilters\" : {\n\t\t\"test1\" : { \"minimumApplicationVersion\" : 10 },\n\t\t\"test2\" : { \"minimumApplicationVersion\" : 10, \"minimumEngineVersion\" : 1000 },\n\t\t\"test3\" : { \"minimumApiVersion\" : 50 },\n\t\t\"test4\" : {\n\t\t\t\"blacklistedEnvironments\" : {\n\t\t\t\t\"TEST_ENV\" : { \"contains\" : \"foo\", \"equals\" : \"bar\" },\n\t\t\t\t\"TEST_ENV\" : { \"equals\" : \"bar2\", \"contains\": \"\" },\n\t\t\t\t\"TEST\" : { \"nonnull\" : true }\n\t\t\t}\n\t\t},\n\t\t\"test5\" : { \"recordImmutableSamplers\" : true },\n\t\t\"test6\" : { \"recordImmutableSamplers\" : false }\n\t},\n\t\"engineFilters\" : {\n\t\t\"test1\" : {\n\t\t\t\"minimumEngineVersion\" : 10,\n\t\t\t\"bucketVariantDependencies\" : [\n\t\t\t\t\"BindlessUBO\",\n\t\t\t\t\"VendorID\",\n\t\t\t\t\"MutableDescriptorType\",\n\t\t\t\t\"BufferDeviceAddress\",\n\t\t\t\t\"DummyIgnored\",\n\t\t\t\t\"ApplicationName\",\n\t\t\t\t\"FragmentShadingRate\",\n\t\t\t\t\"DynamicRendering\"\n\t\t\t]\n\t\t},\n\t\t\"variance\" : {\n\t\t\t\"bucketVariantDependencies\" : [ \"VendorID\" ]\n\t\t},\n\t\t\"variance2\" : {\n\t\t\t\"bucketVariantDependencies\" : [ \"VendorID\" ],\n\t\t\t\"bucketVariantFeatureDependencies\" : [\n\t\t\t\t\"BindlessUBO\",\n\t\t\t\t\"MutableDescriptorType\",\n\t\t\t\t\"BufferDeviceAddress\",\n\t\t\t\t\"DummyIgnored\",\n\t\t\t\t\"FragmentShadingRate\",\n\t\t\t\t\"DynamicRendering\",\n\t\t\t\t\"DescriptorBuffer\"\n\t\t\t]\n\t\t},\n\t\t\"test2\" : { \"minimumEngineVersion\" : 10, \"minimumApplicationVersion\" : 1000 },\n\t\t\"test3\" : { \"minimumApiVersion\" : 50 },\n\t\t\"test4\" : {\n\t\t\t\"blacklistedEnvironments\" : {\n\t\t\t\t\"TEST_ENV\" : { \"contains\" : \"foo\", \"equals\" : \"bar\" },\n\t\t\t\t\"TEST_ENV\" : { \"equals\" : \"bar2\", \"contains\": \"\" },\n\t\t\t\t\"TEST\" : { \"nonnull\" : true }\n\t\t\t}\n\t\t},\n\t\t\"test5\" : { \"recordImmutableSamplers\" : false },\n\t\t\"test6\" : { \"recordImmutableSamplers\" : true }\n\t},\n\t\"defaultBucketVariantDependencies\" : [\n\t\t\"ApplicationName\",\n\t\t\"EngineName\"\n\t],\n\t\"defaultBucketVariantFeatureDependencies\" : [\n\t\t\"DescriptorBuffer\"\n\t]\n}\n"
                    );
  if (bVar1) {
    getenv_wrapper = (_func_char_ptr_char_ptr_void_ptr *)0x0;
    data.env = (char *)0x0;
    getenv_wrapper_00 =
         main::$_0::operator_cast_to_function_pointer
                   ((__0 *)((long)&filter_handle._M_t.
                                   super___uniq_ptr_impl<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Fossilize::ApplicationInfoFilter_*,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
                                   .super__Head_base<0UL,_Fossilize::ApplicationInfoFilter_*,_false>
                                   ._M_head_impl + 7));
    std::
    unique_ptr<Fossilize::ApplicationInfoFilter,std::default_delete<Fossilize::ApplicationInfoFilter>>
    ::unique_ptr<std::default_delete<Fossilize::ApplicationInfoFilter>,void>
              ((unique_ptr<Fossilize::ApplicationInfoFilter,std::default_delete<Fossilize::ApplicationInfoFilter>>
                *)&local_40);
    __p = Fossilize::ApplicationInfoFilter::parse
                    (".__test_appinfo.json",getenv_wrapper_00,&getenv_wrapper);
    std::
    unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
    ::reset(&local_40,__p);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_40);
    if (bVar1) {
      appinfo._40_8_ =
           std::
           unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
           ::operator*(&local_40);
      memset(local_80,0,0x30);
      bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                        ((ApplicationInfoFilter *)appinfo._40_8_,(VkApplicationInfo *)0x0);
      if (bVar1) {
        appinfo.pNext = "A";
        appinfo._24_8_ = anon_var_dwarf_91;
        bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                          ((ApplicationInfoFilter *)appinfo._40_8_,(VkApplicationInfo *)local_80);
        if (bVar1) {
          test_json._4_4_ = 1;
        }
        else {
          appinfo.pNext = "D";
          appinfo._24_8_ = (long)"fooA" + 3;
          bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                            ((ApplicationInfoFilter *)appinfo._40_8_,(VkApplicationInfo *)local_80);
          if (bVar1) {
            appinfo.pNext = anon_var_dwarf_a5;
            appinfo._24_8_ = anon_var_dwarf_af;
            bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                              ((ApplicationInfoFilter *)appinfo._40_8_,(VkApplicationInfo *)local_80
                              );
            if (bVar1) {
              test_json._4_4_ = 1;
            }
            else {
              appinfo.pNext = anon_var_dwarf_b9;
              appinfo.applicationVersion = 0;
              appinfo._28_4_ = 0;
              appinfo.pApplicationName._0_4_ = 9;
              bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                ((ApplicationInfoFilter *)appinfo._40_8_,
                                 (VkApplicationInfo *)local_80);
              if (bVar1) {
                test_json._4_4_ = 1;
              }
              else {
                appinfo.pApplicationName._0_4_ = 10;
                bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                  ((ApplicationInfoFilter *)appinfo._40_8_,
                                   (VkApplicationInfo *)local_80);
                if (bVar1) {
                  appinfo.pNext = anon_var_dwarf_cf;
                  bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                    ((ApplicationInfoFilter *)appinfo._40_8_,
                                     (VkApplicationInfo *)local_80);
                  if (bVar1) {
                    appinfo.pNext = anon_var_dwarf_d9;
                    appinfo.pApplicationName._0_4_ = 0;
                    appinfo.pEngineName._4_4_ = 0x31;
                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                       (VkApplicationInfo *)local_80);
                    if (bVar1) {
                      test_json._4_4_ = 1;
                    }
                    else {
                      appinfo.pEngineName._4_4_ = 0x32;
                      bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                        ((ApplicationInfoFilter *)appinfo._40_8_,
                                         (VkApplicationInfo *)local_80);
                      if (bVar1) {
                        appinfo.pNext = (void *)0x0;
                        appinfo._24_8_ = anon_var_dwarf_b9;
                        appinfo.pEngineName._0_4_ = 9;
                        bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                          ((ApplicationInfoFilter *)appinfo._40_8_,
                                           (VkApplicationInfo *)local_80);
                        if (bVar1) {
                          test_json._4_4_ = 1;
                        }
                        else {
                          appinfo.pEngineName._0_4_ = 10;
                          bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                            ((ApplicationInfoFilter *)appinfo._40_8_,
                                             (VkApplicationInfo *)local_80);
                          if (bVar1) {
                            appinfo._24_8_ = anon_var_dwarf_cf;
                            bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                              ((ApplicationInfoFilter *)appinfo._40_8_,
                                               (VkApplicationInfo *)local_80);
                            if (bVar1) {
                              appinfo._24_8_ = anon_var_dwarf_d9;
                              appinfo.pEngineName._0_4_ = 0;
                              appinfo.pEngineName._4_4_ = 0x31;
                              bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                ((ApplicationInfoFilter *)appinfo._40_8_,
                                                 (VkApplicationInfo *)local_80);
                              if (bVar1) {
                                test_json._4_4_ = 1;
                              }
                              else {
                                appinfo.pEngineName._4_4_ = 0x32;
                                bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                  ((ApplicationInfoFilter *)appinfo._40_8_,
                                                   (VkApplicationInfo *)local_80);
                                if (bVar1) {
                                  appinfo.pEngineName._0_4_ = 0;
                                  appinfo.pApplicationName._0_4_ = 0;
                                  for (local_84 = 0; local_84 < 2; local_84 = local_84 + 1) {
                                    getenv_wrapper = (_func_char_ptr_char_ptr_void_ptr *)0x0;
                                    data.env = (char *)0x0;
                                    if (local_84 == 0) {
                                      appinfo.pNext = anon_var_dwarf_e3;
                                      appinfo.applicationVersion = 0;
                                      appinfo._28_4_ = 0;
                                    }
                                    else {
                                      appinfo._24_8_ = anon_var_dwarf_e3;
                                      appinfo.pNext = (void *)0x0;
                                    }
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (!bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    getenv_wrapper =
                                         (_func_char_ptr_char_ptr_void_ptr *)anon_var_dwarf_ed;
                                    data.env = "foo";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (!bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    getenv_wrapper =
                                         (_func_char_ptr_char_ptr_void_ptr *)anon_var_dwarf_119;
                                    data.env = "foo";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    data.env = "Afoo";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    data.env = "fooA";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    data.env = "bar";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    data.env = "bar2";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    data.env = "bar3";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (!bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    getenv_wrapper =
                                         (_func_char_ptr_char_ptr_void_ptr *)anon_var_dwarf_165;
                                    data.env = (char *)0x0;
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (!bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                    data.env = "";
                                    bVar1 = Fossilize::ApplicationInfoFilter::test_application_info
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (bVar1) {
                                      test_json._4_4_ = 1;
                                      goto LAB_00103a49;
                                    }
                                  }
                                  appinfo.applicationVersion = 0;
                                  appinfo._28_4_ = 0;
                                  appinfo.pNext = anon_var_dwarf_b9;
                                  bVar1 = Fossilize::ApplicationInfoFilter::needs_buckets
                                                    ((ApplicationInfoFilter *)appinfo._40_8_,
                                                     (VkApplicationInfo *)local_80);
                                  if (bVar1) {
                                    appinfo._24_8_ = anon_var_dwarf_b9;
                                    appinfo.pNext = (void *)0x0;
                                    bVar1 = Fossilize::ApplicationInfoFilter::needs_buckets
                                                      ((ApplicationInfoFilter *)appinfo._40_8_,
                                                       (VkApplicationInfo *)local_80);
                                    if (bVar1) {
                                      Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                ((ApplicationInfoFilter *)appinfo._40_8_,
                                                 (VkPhysicalDeviceProperties2 *)0x0,
                                                 (VkApplicationInfo *)0x0,(void *)0x0);
                                      props2.properties._816_8_ =
                                           Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                     ((ApplicationInfoFilter *)appinfo._40_8_,
                                                      (VkPhysicalDeviceProperties2 *)0x0,
                                                      (VkApplicationInfo *)local_80,(void *)0x0);
                                      memset(&hash1,0,0x348);
                                      hash1._0_4_ = 0x3b9bb079;
                                      props2.properties.apiVersion = 1;
                                      HVar2 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                        ((ApplicationInfoFilter *)appinfo._40_8_,
                                                         (VkPhysicalDeviceProperties2 *)&hash1,
                                                         (VkApplicationInfo *)local_80,(void *)0x0);
                                      if (props2.properties._816_8_ == HVar2) {
                                        test_json._4_4_ = 1;
                                      }
                                      else {
                                        vulkan12_features.subgroupBroadcastDynamicId = 0x3b9eb5e8;
                                        vulkan12_features._204_4_ = 0;
                                        memset(&vulkan13_features.maintenance4,0,0xd0);
                                        vulkan13_features.maintenance4 = 0x33;
                                        memset(&indexing_features.
                                                descriptorBindingVariableDescriptorCount,0,0x50);
                                        indexing_features.descriptorBindingVariableDescriptorCount =
                                             0x35;
                                        memset(&mutable_features.mutableDescriptorType,0,0x60);
                                        mutable_features.mutableDescriptorType = 0x3b9d3ee9;
                                        vrs_features.attachmentFragmentShadingRate = 0x3ba02518;
                                        vrs_features._28_4_ = 0;
                                        mutable_features.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                        mutable_features._4_4_ = 0;
                                        mutable_features.pNext = (void *)0x0;
                                        dynamic_rendering_features.dynamicRendering = 0x3b9e3cd3;
                                        dynamic_rendering_features._20_4_ = 0;
                                        vrs_features.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                        vrs_features._4_4_ = 0;
                                        vrs_features.pNext = (void *)0x0;
                                        vrs_features.pipelineFragmentShadingRate = 0;
                                        vrs_features.primitiveFragmentShadingRate = 0;
                                        features2.features.inheritedQueries = 0x3b9b75e3;
                                        features2._236_4_ = 0;
                                        dynamic_rendering_features.sType =
                                             VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                        dynamic_rendering_features._4_4_ = 0;
                                        dynamic_rendering_features.pNext = (void *)0x0;
                                        indexing_features._0_8_ =
                                             &vrs_features.attachmentFragmentShadingRate;
                                        memset(&hash2,0,0xf0);
                                        hash2._0_4_ = 0x3b9bb078;
                                        features2._0_8_ =
                                             &vulkan12_features.subgroupBroadcastDynamicId;
                                        HVar3 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                          ((ApplicationInfoFilter *)appinfo._40_8_,
                                                           (VkPhysicalDeviceProperties2 *)&hash1,
                                                           (VkApplicationInfo *)local_80,&hash2);
                                        if (HVar2 == HVar3) {
                                          HVar2 = Fossilize::ApplicationInfoFilter::get_bucket_hash
                                                            ((ApplicationInfoFilter *)appinfo._40_8_
                                                             ,(VkPhysicalDeviceProperties2 *)&hash1,
                                                             (VkApplicationInfo *)local_80,&hash2);
                                          if (HVar3 == HVar2) {
                                            test_json._4_4_ = 1;
                                          }
                                          else {
                                            indexing_features.
                                            shaderUniformTexelBufferArrayNonUniformIndexing = 1;
                                            HVar3 = Fossilize::ApplicationInfoFilter::
                                                    get_bucket_hash((ApplicationInfoFilter *)
                                                                    appinfo._40_8_,
                                                                    (VkPhysicalDeviceProperties2 *)
                                                                    &hash1,(VkApplicationInfo *)
                                                                           local_80,&hash2);
                                            if (HVar2 == HVar3) {
                                              test_json._4_4_ = 1;
                                            }
                                            else {
                                              mutable_features.pNext =
                                                   (void *)CONCAT44(mutable_features.pNext._4_4_,1);
                                              HVar2 = Fossilize::ApplicationInfoFilter::
                                                      get_bucket_hash((ApplicationInfoFilter *)
                                                                      appinfo._40_8_,
                                                                      (VkPhysicalDeviceProperties2 *
                                                                      )&hash1,(VkApplicationInfo *)
                                                                              local_80,&hash2);
                                              if (HVar3 == HVar2) {
                                                test_json._4_4_ = 1;
                                              }
                                              else {
                                                mutable_features._0_8_ =
                                                     &vulkan13_features.maintenance4;
                                                features2._0_8_ =
                                                     &vrs_features.attachmentFragmentShadingRate;
                                                vulkan12_features.
                                                shaderUniformTexelBufferArrayNonUniformIndexing = 1;
                                                vulkan12_features.hostQueryReset = 1;
                                                HVar3 = Fossilize::ApplicationInfoFilter::
                                                        get_bucket_hash((ApplicationInfoFilter *)
                                                                        appinfo._40_8_,
                                                                        (VkPhysicalDeviceProperties2
                                                                         *)&hash1,
                                                                        (VkApplicationInfo *)
                                                                        local_80,&hash2);
                                                if (HVar2 == HVar3) {
                                                  features2.sType =
                                                       VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                                  features2._4_4_ = 0;
                                                  HVar2 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  features2._0_8_ =
                                                       &dynamic_rendering_features.dynamicRendering;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  if (HVar2 == HVar3) {
                                                    vrs_features.pNext =
                                                         (void *)CONCAT44(1,vrs_features.pNext._0_4_
                                                                         );
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  if (HVar3 == HVar2) {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  else {
                                                    vrs_features.pNext = (void *)0x1;
                                                    HVar3 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  if (HVar2 == HVar3) {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  else {
                                                    vrs_features.pNext =
                                                         (void *)((ulong)vrs_features.pNext &
                                                                 0xffffffff00000000);
                                                    vrs_features.pipelineFragmentShadingRate = 1;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  if (HVar3 == HVar2) {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  else {
                                                    features2.sType =
                                                         VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                                    features2._4_4_ = 0;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  features2._0_8_ =
                                                       &features2.features.inheritedQueries;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  if (HVar2 == HVar3) {
                                                    dynamic_rendering_features.pNext =
                                                         (void *)CONCAT44(dynamic_rendering_features
                                                                          .pNext._4_4_,1);
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  if (HVar3 == HVar2) {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  else {
                                                    vulkan13_features.textureCompressionASTC_HDR = 1
                                                    ;
                                                    features2._0_8_ =
                                                         &indexing_features.
                                                          descriptorBindingVariableDescriptorCount;
                                                    HVar3 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  if (HVar2 == HVar3) {
                                                    appinfo.pNext = "foo";
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  if (HVar2 == HVar3) {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  else {
                                                    appinfo.pNext = anon_var_dwarf_187;
                                                    appinfo._24_8_ = anon_var_dwarf_192;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,&hash2);
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)&hash1,
                                                  (VkApplicationInfo *)local_80,(void *)0x0);
                                                  if (HVar2 == HVar3) {
                                                    memset(&features2_1.features.inheritedQueries,0,
                                                           0x348);
                                                    features2_1.features.inheritedQueries =
                                                         0x3b9bb079;
                                                    memset(&bda_features_1.
                                                            bufferDeviceAddressMultiDevice,0,0xf0);
                                                    bda_features_1.bufferDeviceAddressMultiDevice =
                                                         0x3b9bb078;
                                                    vulkan12_features_1.subgroupBroadcastDynamicId =
                                                         0x3b9eb5e8;
                                                    vulkan12_features_1._204_4_ = 0;
                                                    bda_features_1.sType =
                                                         VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                                    bda_features_1._4_4_ = 0;
                                                    bda_features_1.pNext = (void *)0x0;
                                                    bda_features_1.bufferDeviceAddress = 0;
                                                    bda_features_1.bufferDeviceAddressCaptureReplay
                                                         = 0;
                                                    memset(&vulkan13_features_1.maintenance4,0,0xd0)
                                                    ;
                                                    vulkan13_features_1.maintenance4 = 0x33;
                                                    memset(&indexing_features_1.
                                                            descriptorBindingVariableDescriptorCount
                                                           ,0,0x50);
                                                    indexing_features_1.
                                                    descriptorBindingVariableDescriptorCount = 0x35;
                                                    memset(&mutable_features_1.mutableDescriptorType
                                                           ,0,0x60);
                                                    mutable_features_1.mutableDescriptorType =
                                                         0x3b9d3ee9;
                                                    vrs_features_1.attachmentFragmentShadingRate =
                                                         0x3ba02518;
                                                    vrs_features_1._28_4_ = 0;
                                                    mutable_features_1.sType =
                                                         VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                                    mutable_features_1._4_4_ = 0;
                                                    mutable_features_1.pNext = (void *)0x0;
                                                    descriptor_buffer_features.
                                                    descriptorBufferImageLayoutIgnored = 0x3b9e3cd3;
                                                    descriptor_buffer_features.
                                                    descriptorBufferPushDescriptors = 0;
                                                    vrs_features_1.sType =
                                                         VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                                    vrs_features_1._4_4_ = 0;
                                                    vrs_features_1.pNext = (void *)0x0;
                                                    vrs_features_1.pipelineFragmentShadingRate = 0;
                                                    vrs_features_1.primitiveFragmentShadingRate = 0;
                                                    hash0_1 = 0x3b9f9c62;
                                                    descriptor_buffer_features.sType =
                                                         VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                                    descriptor_buffer_features._4_4_ = 0;
                                                    descriptor_buffer_features.pNext = (void *)0x0;
                                                    descriptor_buffer_features.descriptorBuffer = 0;
                                                    descriptor_buffer_features.
                                                    descriptorBufferCaptureReplay = 0;
                                                    appinfo._24_8_ = anon_var_dwarf_19d;
                                                    appinfo.pNext = (void *)0x0;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  appinfo._24_8_ = anon_var_dwarf_1a8;
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    features2_1._0_8_ = &hash0_1;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    features2_1._0_8_ =
                                                         &vulkan12_features_1.
                                                          subgroupBroadcastDynamicId;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    features2_1._0_8_ =
                                                         &vulkan13_features_1.maintenance4;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    features2_1._0_8_ =
                                                         &indexing_features_1.
                                                          descriptorBindingVariableDescriptorCount;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    features2_1._0_8_ =
                                                         &mutable_features_1.mutableDescriptorType;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    features2_1._0_8_ =
                                                         &vrs_features_1.
                                                          attachmentFragmentShadingRate;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    features2_1._0_8_ =
                                                         &descriptor_buffer_features.
                                                          descriptorBufferImageLayoutIgnored;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    features2_1._0_8_ = &hash0_1;
                                                    descriptor_buffer_features.pNext =
                                                         (void *)CONCAT44(descriptor_buffer_features
                                                                          .pNext._4_4_,1);
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  descriptor_buffer_features.
                                                  descriptorBufferCaptureReplay = 1;
                                                  HVar4 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if ((HVar3 == HVar2) || (HVar2 == HVar4)) {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  else {
                                                    features2_1._0_8_ =
                                                         &vulkan12_features_1.
                                                          subgroupBroadcastDynamicId;
                                                    bda_features_1.pNext =
                                                         (void *)CONCAT44(bda_features_1.pNext._4_4_
                                                                          ,1);
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar3 == HVar2) {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  else {
                                                    features2_1._0_8_ =
                                                         &vulkan13_features_1.maintenance4;
                                                    vulkan12_features_1.hostQueryReset = 1;
                                                    HVar3 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_1.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_1.bufferDeviceAddressMultiDevice);
                                                  if (HVar2 == HVar3) {
                                                    memset(&features2_2.features.inheritedQueries,0,
                                                           0x348);
                                                    features2_2.features.inheritedQueries =
                                                         0x3b9bb079;
                                                    memset(&bda_features_2.
                                                            bufferDeviceAddressMultiDevice,0,0xf0);
                                                    bda_features_2.bufferDeviceAddressMultiDevice =
                                                         0x3b9bb078;
                                                    descriptor_buffer_features_1.
                                                    descriptorBufferImageLayoutIgnored = 0x3b9eb5e8;
                                                    descriptor_buffer_features_1.
                                                    descriptorBufferPushDescriptors = 0;
                                                    bda_features_2.sType =
                                                         VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                                    bda_features_2._4_4_ = 0;
                                                    bda_features_2.pNext = (void *)0x0;
                                                    bda_features_2.bufferDeviceAddress = 0;
                                                    bda_features_2.bufferDeviceAddressCaptureReplay
                                                         = 0;
                                                    hash0_2 = 0x3b9f9c62;
                                                    descriptor_buffer_features_1.sType =
                                                         VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                                    descriptor_buffer_features_1._4_4_ = 0;
                                                    descriptor_buffer_features_1.pNext = (void *)0x0
                                                    ;
                                                    descriptor_buffer_features_1.descriptorBuffer =
                                                         0;
                                                    descriptor_buffer_features_1.
                                                    descriptorBufferCaptureReplay = 0;
                                                    appinfo.applicationVersion = 0;
                                                    appinfo._28_4_ = 0;
                                                    appinfo.pNext = (void *)0x0;
                                                    HVar2 = Fossilize::ApplicationInfoFilter::
                                                            get_bucket_hash((ApplicationInfoFilter *
                                                                            )appinfo._40_8_,
                                                                            (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_2.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_2.bufferDeviceAddressMultiDevice);
                                                  features2_2._0_8_ =
                                                       &descriptor_buffer_features_1.
                                                        descriptorBufferImageLayoutIgnored;
                                                  bda_features_2.pNext =
                                                       (void *)CONCAT44(bda_features_2.pNext._4_4_,1
                                                                       );
                                                  HVar3 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_2.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_2.bufferDeviceAddressMultiDevice);
                                                  features2_2._0_8_ = &hash0_2;
                                                  HVar4 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_2.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_2.bufferDeviceAddressMultiDevice);
                                                  descriptor_buffer_features_1.pNext =
                                                       (void *)CONCAT44(descriptor_buffer_features_1
                                                                        .pNext._4_4_,1);
                                                  HVar5 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_2.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_2.bufferDeviceAddressMultiDevice);
                                                  descriptor_buffer_features_1.
                                                  descriptorBufferCaptureReplay = 1;
                                                  HVar6 = Fossilize::ApplicationInfoFilter::
                                                          get_bucket_hash((ApplicationInfoFilter *)
                                                                          appinfo._40_8_,
                                                                          (
                                                  VkPhysicalDeviceProperties2 *)
                                                  &features2_2.features.inheritedQueries,
                                                  (VkApplicationInfo *)local_80,
                                                  &bda_features_2.bufferDeviceAddressMultiDevice);
                                                  if ((HVar2 == HVar3) && (HVar3 == HVar4)) {
                                                    if ((HVar4 == HVar5) || (HVar5 == HVar6)) {
                                                      test_json._4_4_ = 1;
                                                    }
                                                    else {
                                                      appinfo.pNext = anon_var_dwarf_1bf;
                                                      appinfo.applicationVersion = 0;
                                                      appinfo._28_4_ = 0;
                                                      bVar1 = Fossilize::ApplicationInfoFilter::
                                                              should_record_immutable_samplers
                                                                        ((ApplicationInfoFilter *)
                                                                         appinfo._40_8_,
                                                                         (VkApplicationInfo *)
                                                                         local_80);
                                                      if (bVar1) {
                                                        appinfo.pNext = anon_var_dwarf_1ca;
                                                        bVar1 = Fossilize::ApplicationInfoFilter::
                                                                should_record_immutable_samplers
                                                                          ((ApplicationInfoFilter *)
                                                                           appinfo._40_8_,
                                                                           (VkApplicationInfo *)
                                                                           local_80);
                                                        if (bVar1) {
                                                          test_json._4_4_ = 1;
                                                        }
                                                        else {
                                                          appinfo.pNext = (void *)0x0;
                                                          appinfo._24_8_ = anon_var_dwarf_1bf;
                                                          bVar1 = Fossilize::ApplicationInfoFilter::
                                                                  should_record_immutable_samplers
                                                                            ((ApplicationInfoFilter
                                                                              *)appinfo._40_8_,
                                                                             (VkApplicationInfo *)
                                                                             local_80);
                                                          if (bVar1) {
                                                            test_json._4_4_ = 1;
                                                          }
                                                          else {
                                                            appinfo._24_8_ = anon_var_dwarf_1ca;
                                                            bVar1 = Fossilize::ApplicationInfoFilter
                                                                    ::
                                                  should_record_immutable_samplers
                                                            ((ApplicationInfoFilter *)appinfo._40_8_
                                                             ,(VkApplicationInfo *)local_80);
                                                  if (bVar1) {
                                                    remove(".__test_appinfo.json");
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    test_json._4_4_ = 1;
                                                  }
                                                }
                                                else {
                                                  test_json._4_4_ = 1;
                                                }
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          test_json._4_4_ = 1;
                                        }
                                      }
                                    }
                                    else {
                                      test_json._4_4_ = 1;
                                    }
                                  }
                                  else {
                                    test_json._4_4_ = 1;
                                  }
                                }
                                else {
                                  test_json._4_4_ = 1;
                                }
                              }
                            }
                            else {
                              test_json._4_4_ = 1;
                            }
                          }
                          else {
                            test_json._4_4_ = 1;
                          }
                        }
                      }
                      else {
                        test_json._4_4_ = 1;
                      }
                    }
                  }
                  else {
                    test_json._4_4_ = 1;
                  }
                }
                else {
                  test_json._4_4_ = 1;
                }
              }
            }
          }
          else {
            test_json._4_4_ = 1;
          }
        }
      }
      else {
        test_json._4_4_ = 1;
      }
    }
    else {
      fprintf(_stderr,"Fossilize ERROR: Parsing did not complete successfully.\n");
      test_json._4_4_ = 1;
    }
LAB_00103a49:
    std::
    unique_ptr<Fossilize::ApplicationInfoFilter,_std::default_delete<Fossilize::ApplicationInfoFilter>_>
    ::~unique_ptr(&local_40);
  }
  else {
    test_json._4_4_ = 1;
  }
  return test_json._4_4_;
}

Assistant:

int main()
{
	const char *test_json =
R"delim(
{
	"asset": "FossilizeApplicationInfoFilter",
	"version" : 2,
	"blacklistedApplicationNames" : [ "A",  "B", "C" ],
	"blacklistedEngineNames" : [ "D", "E", "F" ],
	"applicationFilters" : {
		"test1" : { "minimumApplicationVersion" : 10 },
		"test2" : { "minimumApplicationVersion" : 10, "minimumEngineVersion" : 1000 },
		"test3" : { "minimumApiVersion" : 50 },
		"test4" : {
			"blacklistedEnvironments" : {
				"TEST_ENV" : { "contains" : "foo", "equals" : "bar" },
				"TEST_ENV" : { "equals" : "bar2", "contains": "" },
				"TEST" : { "nonnull" : true }
			}
		},
		"test5" : { "recordImmutableSamplers" : true },
		"test6" : { "recordImmutableSamplers" : false }
	},
	"engineFilters" : {
		"test1" : {
			"minimumEngineVersion" : 10,
			"bucketVariantDependencies" : [
				"BindlessUBO",
				"VendorID",
				"MutableDescriptorType",
				"BufferDeviceAddress",
				"DummyIgnored",
				"ApplicationName",
				"FragmentShadingRate",
				"DynamicRendering"
			]
		},
		"variance" : {
			"bucketVariantDependencies" : [ "VendorID" ]
		},
		"variance2" : {
			"bucketVariantDependencies" : [ "VendorID" ],
			"bucketVariantFeatureDependencies" : [
				"BindlessUBO",
				"MutableDescriptorType",
				"BufferDeviceAddress",
				"DummyIgnored",
				"FragmentShadingRate",
				"DynamicRendering",
				"DescriptorBuffer"
			]
		},
		"test2" : { "minimumEngineVersion" : 10, "minimumApplicationVersion" : 1000 },
		"test3" : { "minimumApiVersion" : 50 },
		"test4" : {
			"blacklistedEnvironments" : {
				"TEST_ENV" : { "contains" : "foo", "equals" : "bar" },
				"TEST_ENV" : { "equals" : "bar2", "contains": "" },
				"TEST" : { "nonnull" : true }
			}
		},
		"test5" : { "recordImmutableSamplers" : false },
		"test6" : { "recordImmutableSamplers" : true }
	},
	"defaultBucketVariantDependencies" : [
		"ApplicationName",
		"EngineName"
	],
	"defaultBucketVariantFeatureDependencies" : [
		"DescriptorBuffer"
	]
}
)delim";

	if (!write_string_to_file(".__test_appinfo.json", test_json))
		return EXIT_FAILURE;

	struct UserData
	{
		const char *env = nullptr;
		const char *data = nullptr;
	} data = {};

	const auto getenv_wrapper = +[](const char *env, void *userdata) -> const char *
	{
		auto *env_data = static_cast<const UserData *>(userdata);
		if (env_data->env && strcmp(env_data->env, env) == 0)
			return env_data->data;
		else
			return nullptr;
	};

	std::unique_ptr<Fossilize::ApplicationInfoFilter> filter_handle;
	filter_handle.reset(Fossilize::ApplicationInfoFilter::parse(".__test_appinfo.json",
																getenv_wrapper, &data));

	if (!filter_handle)
	{
		LOGE("Parsing did not complete successfully.\n");
		return EXIT_FAILURE;
	}

	auto &filter = *filter_handle;

	VkApplicationInfo appinfo = { VK_STRUCTURE_TYPE_APPLICATION_INFO };

	if (!filter.test_application_info(nullptr))
		return EXIT_FAILURE;

	// Test blacklists
	appinfo.pApplicationName = "A";
	appinfo.pEngineName = "G";
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "D";
	appinfo.pEngineName = "A";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "H";
	appinfo.pEngineName = "E";
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Test application version filtering
	appinfo.pApplicationName = "test1";
	appinfo.pEngineName = nullptr;
	appinfo.applicationVersion = 9;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;
	appinfo.applicationVersion = 10;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Engine version should be ignored for appinfo filters.
	appinfo.pApplicationName = "test2";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pApplicationName = "test3";
	appinfo.applicationVersion = 0;
	appinfo.apiVersion = 49;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.apiVersion = 50;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Test engine version filtering
	appinfo.pApplicationName = nullptr;
	appinfo.pEngineName = "test1";
	appinfo.engineVersion = 9;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;
	appinfo.engineVersion = 10;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	// Engine version should be ignored for appinfo filters.
	appinfo.pEngineName = "test2";
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.pEngineName = "test3";
	appinfo.engineVersion = 0;
	appinfo.apiVersion = 49;
	if (filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.apiVersion = 50;
	if (!filter.test_application_info(&appinfo))
		return EXIT_FAILURE;

	appinfo.engineVersion = 0;
	appinfo.applicationVersion = 0;

	for (unsigned i = 0; i < 2; i++)
	{
		data = {};

		// Test env blacklisting (application)
		if (i == 0)
		{
			appinfo.pApplicationName = "test4";
			appinfo.pEngineName = nullptr;
		}
		else
		{
			appinfo.pEngineName = "test4";
			appinfo.pApplicationName = nullptr;
		}

		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.env = "TEST_FOO";
		data.data = "foo";

		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Contains test, should fail
		data.env = "TEST_ENV";

		data.data = "foo";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.data = "Afoo";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		data.data = "fooA";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Equals bar, should fail
		data.data = "bar";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Equals bar2, should fail
		data.data = "bar2";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should not fail
		data.data = "bar3";
		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should not fail
		data.env = "TEST";
		data.data = nullptr;
		if (!filter.test_application_info(&appinfo))
			return EXIT_FAILURE;

		// Should fail
		data.data = "";
		if (filter.test_application_info(&appinfo))
			return EXIT_FAILURE;
	}

	// Test bucket variant filter.
	appinfo.pEngineName = nullptr;
	appinfo.pApplicationName = "test1";
	if (!filter.needs_buckets(&appinfo))
		return EXIT_FAILURE;

	appinfo.pEngineName = "test1";
	appinfo.pApplicationName = nullptr;
	if (!filter.needs_buckets(&appinfo))
		return EXIT_FAILURE;

	{
		// Make sure this doesn't crash.
		filter.get_bucket_hash(nullptr, nullptr, nullptr);

		auto hash0 = filter.get_bucket_hash(nullptr, &appinfo, nullptr);
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		props2.properties.vendorID = 1;
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, nullptr);
		if (hash0 == hash1)
			return EXIT_FAILURE;

		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceVulkan12Features vulkan12_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES };
		VkPhysicalDeviceVulkan13Features vulkan13_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES };
		VkPhysicalDeviceDescriptorIndexingFeatures indexing_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES };
		VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT };
		VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
		VkPhysicalDeviceDynamicRenderingFeatures dynamic_rendering_features = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DYNAMIC_RENDERING_FEATURES };

		bda_features.pNext = &indexing_features;
		indexing_features.pNext = &mutable_features;
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		features2.pNext = &bda_features;

		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 != hash2)
			return EXIT_FAILURE;

		// Try to enable one feature at a time and verify it's the same.
		bda_features.bufferDeviceAddress = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash2 == hash3)
			return EXIT_FAILURE;

		indexing_features.descriptorBindingUniformBufferUpdateAfterBind = VK_TRUE;
		auto hash4 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash3 == hash4)
			return EXIT_FAILURE;

		mutable_features.mutableDescriptorType = VK_TRUE;
		auto hash5 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash4 == hash5)
			return EXIT_FAILURE;

		// Verify that the 1.2 structs can also be used.
		mutable_features.pNext = &vulkan12_features;
		features2.pNext = &mutable_features;
		vulkan12_features.descriptorBindingUniformBufferUpdateAfterBind = VK_TRUE;
		vulkan12_features.bufferDeviceAddress = VK_TRUE;
		auto hash6 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash5 != hash6)
			return EXIT_FAILURE;

		features2.pNext = nullptr;
		auto hash7 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &vrs_features;
		auto hash8 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash7 != hash8)
			return EXIT_FAILURE;
		vrs_features.primitiveFragmentShadingRate = VK_TRUE;
		auto hash9 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash8 == hash9)
			return EXIT_FAILURE;
		vrs_features.primitiveFragmentShadingRate = VK_FALSE;
		vrs_features.pipelineFragmentShadingRate = VK_TRUE;
		auto hash10 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash9 == hash10)
			return EXIT_FAILURE;
		vrs_features.pipelineFragmentShadingRate = VK_FALSE;
		vrs_features.attachmentFragmentShadingRate = VK_TRUE;
		auto hash11 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash10 == hash11)
			return EXIT_FAILURE;

		features2.pNext = nullptr;
		auto hash12 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &dynamic_rendering_features;
		auto hash13 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash12 != hash13)
			return EXIT_FAILURE;
		dynamic_rendering_features.dynamicRendering = VK_TRUE;
		auto hash14 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash13 == hash14)
			return EXIT_FAILURE;
		vulkan13_features.dynamicRendering = VK_TRUE;
		features2.pNext = &vulkan13_features;
		auto hash15 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash14 != hash15)
			return EXIT_FAILURE;

		// Spot check for ApplicationName.
		appinfo.pApplicationName = "foo";
		auto hash16 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash16 == hash15)
			return EXIT_FAILURE;

		// Check that the default variant hash is used.
		appinfo.pApplicationName = "blah";
		appinfo.pEngineName = "blah2";
		auto hash17 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		auto hash18 = filter.get_bucket_hash(&props2, &appinfo, nullptr);
		if (hash17 != hash18)
			return EXIT_FAILURE;
	}

	// Test that feature hashing works as intended.
	{
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceVulkan12Features vulkan12_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES };
		VkPhysicalDeviceVulkan13Features vulkan13_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES };
		VkPhysicalDeviceDescriptorIndexingFeatures indexing_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_INDEXING_FEATURES };
		VkPhysicalDeviceMutableDescriptorTypeFeaturesEXT mutable_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_MUTABLE_DESCRIPTOR_TYPE_FEATURES_EXT };
		VkPhysicalDeviceFragmentShadingRateFeaturesKHR vrs_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FRAGMENT_SHADING_RATE_FEATURES_KHR };
		VkPhysicalDeviceDescriptorBufferFeaturesEXT descriptor_buffer_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT };

		props2.properties.vendorID = 1;
		appinfo.pEngineName = "variance";
		appinfo.pApplicationName = nullptr;

		auto hash0 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		appinfo.pEngineName = "variance2";
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, &features2);

		if (hash0 != hash1)
			return EXIT_FAILURE;

		// Ensure that hashing disabled structs does not change anything either.
		features2.pNext = &descriptor_buffer_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &bda_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vulkan12_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vulkan13_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &indexing_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &mutable_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &vrs_features;
		if (filter.get_bucket_hash(&props2, &appinfo, &features2) != hash1)
			return EXIT_FAILURE;

		features2.pNext = &descriptor_buffer_features;
		descriptor_buffer_features.descriptorBuffer = VK_TRUE;
		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBufferPushDescriptors = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 == hash2 || hash2 == hash3)
			return EXIT_FAILURE;

		features2.pNext = &bda_features;
		bda_features.bufferDeviceAddress = VK_TRUE;
		hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash1 == hash2)
			return EXIT_FAILURE;
		features2.pNext = &vulkan12_features;
		vulkan12_features.bufferDeviceAddress = VK_TRUE;
		hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		if (hash2 != hash3)
			return EXIT_FAILURE;
	}

	// Test that we can pick up defaultFeatureVariantFilter.
	{
		VkPhysicalDeviceProperties2 props2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2 };
		VkPhysicalDeviceFeatures2 features2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
		VkPhysicalDeviceBufferDeviceAddressFeatures bda_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_BUFFER_DEVICE_ADDRESS_FEATURES };
		VkPhysicalDeviceDescriptorBufferFeaturesEXT descriptor_buffer_features =
				{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_DESCRIPTOR_BUFFER_FEATURES_EXT };

		props2.properties.vendorID = 1;
		appinfo.pEngineName = nullptr;
		appinfo.pApplicationName = nullptr;

		auto hash0 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &bda_features;
		bda_features.bufferDeviceAddress = VK_TRUE;
		auto hash1 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		features2.pNext = &descriptor_buffer_features;
		auto hash2 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBuffer = VK_TRUE;
		auto hash3 = filter.get_bucket_hash(&props2, &appinfo, &features2);
		descriptor_buffer_features.descriptorBufferPushDescriptors = VK_TRUE;
		auto hash4 = filter.get_bucket_hash(&props2, &appinfo, &features2);

		if (hash0 != hash1 || hash1 != hash2)
			return EXIT_FAILURE;
		if (hash2 == hash3 || hash3 == hash4)
			return EXIT_FAILURE;
	}

	{
		appinfo.pApplicationName = "test5";
		appinfo.pEngineName = nullptr;
		if (!filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pApplicationName = "test6";
		if (filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pApplicationName = nullptr;
		appinfo.pEngineName = "test5";
		if (filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
		appinfo.pEngineName = "test6";
		if (!filter.should_record_immutable_samplers(&appinfo))
			return EXIT_FAILURE;
	}

	remove(".__test_appinfo.json");
}